

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteCast(Unsubtyping *this,HeapType src,HeapType dest)

{
  bool bVar1;
  mapped_type *this_00;
  Unsubtyping *this_local;
  HeapType dest_local;
  HeapType src_local;
  
  this_local = (Unsubtyping *)dest.id;
  dest_local = src;
  bVar1 = HeapType::operator==(&dest_local,(HeapType *)&this_local);
  if ((!bVar1) && (bVar1 = HeapType::isBottom((HeapType *)&this_local), !bVar1)) {
    bVar1 = HeapType::isSubType((HeapType)this_local,dest_local);
    if (!bVar1) {
      __assert_fail("HeapType::isSubType(dest, src)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                    ,0xe3,
                    "void wasm::(anonymous namespace)::Unsubtyping::noteCast(HeapType, HeapType)");
    }
    this_00 = std::
              unordered_map<wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
              ::operator[](&this->castTypes,&dest_local);
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::insert(this_00,(value_type *)&this_local);
  }
  return;
}

Assistant:

void noteCast(HeapType src, HeapType dest) {
    if (src == dest || dest.isBottom()) {
      return;
    }
    assert(HeapType::isSubType(dest, src));
    castTypes[src].insert(dest);
  }